

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  ma_gainer *pGainer;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  uint channelsOut;
  ma_uint32 channelsIn;
  ma_attenuation_model mVar6;
  ma_handedness mVar7;
  ma_channel *pChannelMapOut;
  float *pfVar8;
  double dVar9;
  ma_vec3f *pmVar10;
  ma_spatializer *pmVar11;
  ma_uint64 frameCount_00;
  ma_result mVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  void *__s;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined8 uVar27;
  ma_vec3f relativePos;
  ma_vec3f relativeDir;
  ma_channel_mix_mode in_stack_fffffffffffffee0;
  ma_mono_expansion_mode in_stack_fffffffffffffee8;
  ma_vec3f local_108;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  ma_uint32 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ma_vec3f local_b0;
  ma_spatializer *local_a0;
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ma_channel *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  float fStack_3c;
  
  if (pSpatializer == (ma_spatializer *)0x0) {
    mVar12 = MA_INVALID_ARGS;
  }
  else {
    local_60 = pSpatializer->pChannelMapIn;
    pChannelMapOut = (pListener->config).pChannelMapOut;
    local_a0 = pSpatializer;
    if (pSpatializer->attenuationModel == ma_attenuation_model_none) {
      if ((pListener == (ma_spatializer_listener *)0x0) || (pListener->isEnabled == 0)) {
        for (uVar15 = (pSpatializer->channelsOut << 2) * frameCount; uVar15 != 0;
            uVar15 = uVar15 - sVar16) {
          sVar16 = 0xffffffff;
          if (uVar15 < 0xffffffff) {
            sVar16 = uVar15;
          }
          memset(pFramesOut,0,sVar16);
          pFramesOut = (void *)((long)pFramesOut + sVar16);
        }
      }
      else {
        channelsIn = pSpatializer->channelsIn;
        if (channelsIn == pSpatializer->channelsOut) {
          if (pFramesOut != pFramesIn) {
            for (uVar15 = (channelsIn << 2) * frameCount; uVar15 != 0; uVar15 = uVar15 - sVar16) {
              sVar16 = 0xffffffff;
              if (uVar15 < 0xffffffff) {
                sVar16 = uVar15;
              }
              memcpy(pFramesOut,pFramesIn,sVar16);
              pFramesOut = (void *)((long)pFramesOut + sVar16);
              pFramesIn = (void *)((long)pFramesIn + sVar16);
            }
          }
        }
        else {
          ma_channel_map_apply_f32
                    ((float *)pFramesOut,pChannelMapOut,pSpatializer->channelsOut,(float *)pFramesIn
                     ,local_60,channelsIn,frameCount,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffee8);
        }
      }
      local_a0->dopplerPitch = 1.0;
    }
    else {
      local_cc = pSpatializer->channelsIn;
      channelsOut = pSpatializer->channelsOut;
      uVar15 = (ulong)channelsOut;
      fVar19 = pSpatializer->minDistance;
      fVar22 = pSpatializer->maxDistance;
      _local_e8 = ZEXT416((uint)pSpatializer->rolloff);
      local_ec = pSpatializer->dopplerFactor;
      if (pListener == (ma_spatializer_listener *)0x0) {
        local_f4 = 0.0;
        local_58 = 0;
        local_f0 = 343.3;
      }
      else {
        local_58._0_4_ = (pListener->velocity).x;
        local_58._4_4_ = (pListener->velocity).y;
        local_f4 = (pListener->velocity).z;
        local_f0 = (pListener->config).speedOfSound;
      }
      uStack_50 = 0;
      if ((pListener == (ma_spatializer_listener *)0x0) ||
         (pSpatializer->positioning == ma_positioning_relative)) {
        local_108.z = (pSpatializer->position).z;
        local_108.x = (pSpatializer->position).x;
        local_108.y = (pSpatializer->position).y;
        local_b0.x = (pSpatializer->direction).x;
        local_b0.y = (pSpatializer->direction).y;
        local_b0.z = (pSpatializer->direction).z;
      }
      else {
        ma_spatializer_get_relative_position_and_direction
                  (pSpatializer,pListener,&local_108,&local_b0);
      }
      fVar17 = local_108.z * local_108.z + local_108.x * local_108.x + local_108.y * local_108.y;
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      mVar6 = pSpatializer->attenuationModel;
      fVar18 = 1.0;
      if (mVar6 == ma_attenuation_model_exponential) {
        if (fVar19 < fVar22) {
          fVar18 = fVar17;
          if (fVar22 <= fVar17) {
            fVar18 = fVar22;
          }
          fVar22 = fVar19;
          if (fVar19 <= fVar18) {
            fVar22 = fVar18;
          }
          dVar9 = pow((double)(fVar22 / fVar19),(double)-(float)local_e8._0_4_);
          fVar18 = (float)dVar9;
        }
      }
      else if (mVar6 == ma_attenuation_model_linear) {
        if (fVar19 < fVar22) {
          fVar18 = fVar17;
          if (fVar22 <= fVar17) {
            fVar18 = fVar22;
          }
          fVar20 = fVar19;
          if (fVar19 <= fVar18) {
            fVar20 = fVar18;
          }
          fVar18 = 1.0 - ((fVar20 - fVar19) * (float)local_e8._0_4_) / (fVar22 - fVar19);
        }
      }
      else if ((mVar6 == ma_attenuation_model_inverse) && (fVar19 < fVar22)) {
        fVar18 = fVar17;
        if (fVar22 <= fVar17) {
          fVar18 = fVar22;
        }
        fVar22 = fVar19;
        if (fVar19 <= fVar18) {
          fVar22 = fVar18;
        }
        fVar18 = fVar19 / ((float)local_e8._0_4_ * (fVar22 - fVar19) + fVar19);
      }
      fVar21 = 0.0;
      fVar22 = 0.0;
      fVar23 = 0.0;
      fVar20 = 0.0;
      fVar19 = 0.0;
      if (0.001 < fVar17) {
        fVar20 = 1.0 / fVar17;
        fVar23 = local_108.y;
        fVar21 = fVar20 * local_108.x;
        fVar22 = fVar23 * fVar20;
        fVar20 = fVar20 * local_108.z;
        fVar19 = fVar17;
      }
      local_c8 = pListener;
      if (0.0 < fVar19) {
        uStack_40 = 0;
        fVar17 = fVar22;
        fVar24 = fVar22;
        fVar25 = fVar22;
        fVar26 = 1.0;
        local_d0 = fVar20;
        local_48 = fVar21;
        fStack_44 = fVar22;
        fStack_3c = fVar23;
        if (pSpatializer->coneInnerAngleInRadians < 6.283185) {
          local_88._0_4_ = local_b0.x;
          local_88._4_4_ = local_b0.y;
          uStack_80 = 0;
          local_98 = -fVar21;
          fStack_94 = -fVar22;
          fStack_8c = -fVar23;
          uStack_90 = 0x80000000;
          fVar20 = local_b0.z * fVar20;
          local_e8._4_4_ = fVar22;
          local_e8._0_4_ = fVar22;
          fStack_e0 = fVar22;
          fStack_dc = fVar22;
          local_f8 = pSpatializer->coneOuterGain;
          local_d8 = pSpatializer->coneOuterAngleInRadians;
          dVar9 = sin(1.5707963267948966 - (double)(pSpatializer->coneInnerAngleInRadians * 0.5));
          local_d4 = (float)dVar9;
          dVar9 = sin(1.5707963267948966 - (double)(local_d8 * 0.5));
          fVar20 = (local_98 * (float)local_88._0_4_ - (float)local_88._4_4_ * (float)local_e8._0_4_
                   ) - fVar20;
          fVar22 = (float)local_e8._0_4_;
          fVar17 = (float)local_e8._4_4_;
          fVar24 = fStack_e0;
          fVar25 = fStack_dc;
          fVar26 = 1.0;
          if ((fVar20 <= local_d4) && (fVar23 = (float)dVar9, fVar26 = local_f8, fVar23 < fVar20)) {
            fVar20 = (fVar20 - fVar23) / (local_d4 - fVar23);
            fVar26 = local_f8 * (1.0 - fVar20) + fVar20;
          }
        }
        fVar18 = fVar18 * fVar26;
        if ((pListener != (ma_spatializer_listener *)0x0) &&
           (fVar20 = (pListener->config).coneInnerAngleInRadians, fVar20 < 6.283185)) {
          mVar7 = (pListener->config).handedness;
          local_98 = (pListener->config).coneOuterGain;
          fVar23 = (pListener->config).coneOuterAngleInRadians;
          local_e8._4_4_ = fVar17;
          local_e8._0_4_ = fVar22;
          fStack_e0 = fVar24;
          fStack_dc = fVar25;
          dVar9 = sin(1.5707963267948966 - (double)(fVar20 * 0.5));
          local_88._0_4_ = (float)dVar9;
          dVar9 = sin(1.5707963267948966 - (double)(fVar23 * 0.5));
          fVar22 = local_d0 * *(float *)(&DAT_001c01e0 + (ulong)(mVar7 == ma_handedness_right) * 4)
                   + local_48 * 0.0 + (float)local_e8._0_4_ * 0.0;
          if (fVar22 <= (float)local_88._0_4_) {
            fVar20 = (float)dVar9;
            fVar17 = local_98;
            if (fVar20 < fVar22) {
              fVar22 = (fVar22 - fVar20) / ((float)local_88._0_4_ - fVar20);
              fVar17 = local_98 * (1.0 - fVar22) + fVar22;
            }
          }
          else {
            fVar17 = 1.0;
          }
          fVar18 = fVar18 * fVar17;
          pListener = local_c8;
        }
      }
      fVar22 = fVar18;
      if (pSpatializer->maxGain <= fVar18) {
        fVar22 = pSpatializer->maxGain;
      }
      lVar13 = 0x1c;
      if ((fVar22 < pSpatializer->minGain) || (lVar13 = 0x20, pSpatializer->maxGain <= fVar18)) {
        fVar18 = *(float *)((long)&pSpatializer->channelsIn + lVar13);
      }
      if (pChannelMapOut == (ma_channel *)0x0) {
        __assert_fail("pChannelMapOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9414,
                      "ma_result ma_spatializer_process_pcm_frames(ma_spatializer *, ma_spatializer_listener *, void *, const void *, ma_uint64)"
                     );
      }
      if (uVar15 != 0) {
        pfVar8 = pSpatializer->pNewChannelGainsOut;
        uVar14 = 0;
        do {
          pfVar8[uVar14] = fVar18;
          uVar14 = uVar14 + 1;
        } while (uVar15 != uVar14);
      }
      local_78 = frameCount;
      if ((pListener == (ma_spatializer_listener *)0x0) || (pListener->isEnabled == 0)) {
        __s = pFramesOut;
        for (uVar14 = (pSpatializer->channelsOut << 2) * frameCount; uVar14 != 0;
            uVar14 = uVar14 - sVar16) {
          sVar16 = 0xffffffff;
          if (uVar14 < 0xffffffff) {
            sVar16 = uVar14;
          }
          memset(__s,0,sVar16);
          __s = (void *)((long)__s + sVar16);
        }
      }
      else {
        ma_channel_map_apply_f32
                  ((float *)pFramesOut,pChannelMapOut,channelsOut,(float *)pFramesIn,local_60,
                   local_cc,frameCount,(ma_channel_mix_mode)fVar19,
                   (ma_mono_expansion_mode)pChannelMapOut);
      }
      frameCount_00 = local_78;
      pmVar11 = local_a0;
      if ((0.0 < fVar19) && (uVar15 != 0)) {
        fVar19 = 1.0 / fVar19;
        uVar14 = 0;
        do {
          bVar5 = pChannelMapOut[uVar14];
          if (((5 < bVar5) || (fVar22 = 1.0, (0x23U >> (bVar5 & 0x1f) & 1) == 0)) &&
             (fVar22 = 1.0, 0x1f < (byte)(bVar5 - 0x14))) {
            lVar13 = 0;
            do {
              fVar22 = *(float *)((long)g_maChannelPlaneRatios[0] +
                                 (ulong)((uint)bVar5 * 8) * 3 + lVar13 * 4);
              if ((fVar22 != 0.0) || (NAN(fVar22))) {
                uVar27 = 0;
                fVar22 = -1.0;
                if (bVar5 < 0x34) {
                  uVar27._0_4_ = g_maChannelDirections[bVar5].x;
                  uVar27._4_4_ = g_maChannelDirections[bVar5].y;
                  fVar22 = g_maChannelDirections[bVar5].z;
                }
                fVar22 = (((float)((ulong)uVar27 >> 0x20) * local_108.y * fVar19 +
                           fVar19 * local_108.x * (float)uVar27 + fVar22 * fVar19 * local_108.z +
                          -1.0) * local_a0->directionalAttenuationFactor + 1.0 + 1.0) * 0.5;
                goto LAB_001a050e;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 6);
            fVar22 = 1.0;
          }
LAB_001a050e:
          if (fVar22 <= 0.2) {
            fVar22 = 0.2;
          }
          local_a0->pNewChannelGainsOut[uVar14] = fVar22 * local_a0->pNewChannelGainsOut[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar15);
      }
      pGainer = &local_a0->gainer;
      ma_gainer_set_gains(pGainer,local_a0->pNewChannelGainsOut);
      ma_gainer_process_pcm_frames(pGainer,pFramesOut,pFramesOut,frameCount_00);
      fVar19 = 1.0;
      if (0.0 < local_ec) {
        uVar1 = (local_c8->position).x;
        uVar3 = (local_c8->position).y;
        pmVar10 = &local_c8->position;
        uVar2 = (pmVar11->position).x;
        uVar4 = (pmVar11->position).y;
        local_c8._0_4_ = (float)uVar1 - (float)uVar2;
        local_c8._4_4_ = (float)uVar3 - (float)uVar4;
        local_78._0_4_ = (pmVar11->velocity).x;
        local_78._4_4_ = (pmVar11->velocity).y;
        fVar18 = pmVar10->z - (pmVar11->position).z;
        fVar22 = (pmVar11->velocity).z;
        fVar17 = fVar18 * fVar18 +
                 (float)local_c8 * (float)local_c8 + local_c8._4_4_ * local_c8._4_4_;
        if (fVar17 < 0.0) {
          uStack_70 = 0;
          uStack_c0 = 0;
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        fVar19 = 1.0;
        if ((fVar17 != 0.0) || (NAN(fVar17))) {
          fVar19 = (local_f4 * fVar18 +
                   local_58._4_4_ * local_c8._4_4_ + (float)local_c8 * (float)local_58) / fVar17;
          fVar17 = (fVar22 * fVar18 +
                   (float)local_78 * (float)local_c8 + local_c8._4_4_ * local_78._4_4_) / fVar17;
          fVar22 = local_f0 / local_ec;
          if (fVar22 <= fVar19) {
            fVar19 = fVar22;
          }
          if (fVar22 <= fVar17) {
            fVar17 = fVar22;
          }
          fVar19 = (local_f0 - fVar19 * local_ec) / (local_f0 - fVar17 * local_ec);
        }
      }
      pmVar11->dopplerPitch = fVar19;
    }
    mVar12 = MA_SUCCESS;
  }
  return mVar12;
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (c89atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The volocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = pListener->velocity;
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = pSpatializer->position;
            relativeDir = pSpatializer->direction;
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source anglular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will  result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = 0.2f;  /* TODO: Consider making this configurable. */

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(pListener->position, pSpatializer->position), pSpatializer->velocity, listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}